

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_t l;
  StkId pTVar8;
  size_t l_00;
  int *piVar9;
  Value *pVVar10;
  int total;
  char *pcVar11;
  Value VVar12;
  char buff [40];
  
  total = 1;
  do {
    pcVar4 = strchr(fmt,0x25);
    lVar5 = (long)L->stack_last - (long)L->top;
    if (pcVar4 == (char *)0x0) {
      if (lVar5 < 0x11) {
        luaD_growstack(L,1);
      }
      l_00 = strlen(fmt);
      pushstr(L,fmt,l_00);
      if (total != 1) {
        luaV_concat(L,total);
      }
      return (char *)(L->top[-1].value_.f + 0x18);
    }
    if (lVar5 < 0x21) {
      luaD_growstack(L,2);
    }
    pushstr(L,fmt,(long)pcVar4 - (long)fmt);
    cVar1 = pcVar4[1];
    if (cVar1 == '%') {
      pcVar11 = "%";
LAB_0010bce9:
      l = 1;
LAB_0010bd1c:
      pushstr(L,pcVar11,l);
    }
    else {
      if (cVar1 == 'c') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          pcVar11 = (char *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          pcVar11 = (char *)argp->overflow_arg_area;
          argp->overflow_arg_area = pcVar11 + 8;
        }
        buff[0] = *pcVar11;
        pcVar11 = buff;
        goto LAB_0010bce9;
      }
      if (cVar1 != 'd') {
        if (cVar1 == 'f') {
          pTVar8 = L->top;
          L->top = pTVar8 + 1;
          uVar2 = argp->fp_offset;
          if ((ulong)uVar2 < 0xa1) {
            pVVar10 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->fp_offset = uVar2 + 0x10;
          }
          else {
            pVVar10 = (Value *)argp->overflow_arg_area;
            argp->overflow_arg_area = pVVar10 + 1;
          }
          VVar12 = *pVVar10;
          goto LAB_0010bd45;
        }
        if (cVar1 == 'p') {
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar7 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            puVar7 = (undefined8 *)argp->overflow_arg_area;
            argp->overflow_arg_area = puVar7 + 1;
          }
          iVar3 = sprintf(buff,"%p",*puVar7);
          l = (size_t)iVar3;
          pcVar11 = buff;
        }
        else {
          if (cVar1 != 's') {
            luaG_runerror(L,"invalid option \'%%%c\' to \'lua_pushfstring\'",(ulong)(uint)(int)cVar1
                         );
          }
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            plVar6 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            plVar6 = (long *)argp->overflow_arg_area;
            argp->overflow_arg_area = plVar6 + 1;
          }
          pcVar11 = (char *)*plVar6;
          if (pcVar11 == (char *)0x0) {
            pcVar11 = "(null)";
          }
          l = strlen(pcVar11);
        }
        goto LAB_0010bd1c;
      }
      pTVar8 = L->top;
      L->top = pTVar8 + 1;
      uVar2 = argp->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar9 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        piVar9 = (int *)argp->overflow_arg_area;
        argp->overflow_arg_area = piVar9 + 2;
      }
      VVar12.n = (lua_Number)*piVar9;
LAB_0010bd45:
      pTVar8->value_ = VVar12;
      pTVar8->tt_ = 3;
    }
    fmt = pcVar4 + 2;
    total = total + 2;
  } while( true );
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  int n = 0;
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    luaD_checkstack(L, 2);  /* fmt + item */
    pushstr(L, fmt, e - fmt);
    switch (*(e+1)) {
      case 's': {
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        pushstr(L, s, strlen(s));
        break;
      }
      case 'c': {
        char buff;
        buff = cast(char, va_arg(argp, int));
        pushstr(L, &buff, 1);
        break;
      }
      case 'd': {
        setnvalue(L->top++, cast_num(va_arg(argp, int)));
        break;
      }
      case 'f': {
        setnvalue(L->top++, cast_num(va_arg(argp, l_uacNumber)));
        break;
      }
      case 'p': {
        char buff[4*sizeof(void *) + 8]; /* should be enough space for a `%p' */
        int l = sprintf(buff, "%p", va_arg(argp, void *));
        pushstr(L, buff, l);
        break;
      }
      case '%': {
        pushstr(L, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L,
            "invalid option " LUA_QL("%%%c") " to " LUA_QL("lua_pushfstring"),
            *(e + 1));
      }
    }
    n += 2;
    fmt = e+2;
  }
  luaD_checkstack(L, 1);
  pushstr(L, fmt, strlen(fmt));
  if (n > 0) luaV_concat(L, n + 1);
  return svalue(L->top - 1);
}